

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O0

void __thiscall icu_63::number::impl::MacroProps::MacroProps(MacroProps *this,MacroProps *param_1)

{
  FractionSignificantSettings FVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  AffixPatternProvider *pAVar4;
  PluralRules *pPVar5;
  UNumberFormatRoundingMode UVar6;
  int16_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  undefined2 uVar10;
  UNumberGroupingStrategy UVar11;
  UNumberFormatRoundingMode UVar12;
  undefined4 uVar13;
  PrecisionType PVar14;
  undefined4 uVar15;
  UNumberSignDisplay UVar16;
  MacroProps *param_1_local;
  MacroProps *this_local;
  
  (this->notation).fUnion.scientific.fExponentSignDisplay =
       (param_1->notation).fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)&this->notation = *(undefined8 *)&param_1->notation;
  MeasureUnit::MeasureUnit(&this->unit,&param_1->unit);
  MeasureUnit::MeasureUnit(&this->perUnit,&param_1->perUnit);
  *(undefined8 *)((long)&(this->integerWidth).fUnion + 1) =
       *(undefined8 *)((long)&(param_1->integerWidth).fUnion + 1);
  PVar14 = (param_1->precision).fType;
  uVar15 = *(undefined4 *)&(param_1->precision).field_0x4;
  FVar1 = (param_1->precision).fUnion.fracSig;
  uVar2 = *(undefined8 *)((long)&(param_1->precision).fUnion + 8);
  UVar12 = (param_1->precision).fRoundingMode;
  uVar13 = *(undefined4 *)&(param_1->precision).field_0x1c;
  UVar6 = param_1->roundingMode;
  iVar7 = (param_1->grouper).fGrouping1;
  iVar8 = (param_1->grouper).fGrouping2;
  iVar9 = (param_1->grouper).fMinGrouping;
  uVar10 = *(undefined2 *)&(param_1->grouper).field_0x6;
  UVar11 = (param_1->grouper).fStrategy;
  uVar3 = *(undefined8 *)((long)&(param_1->padder).fUnion + 4);
  *(undefined8 *)&this->padder = *(undefined8 *)&param_1->padder;
  *(undefined8 *)((long)&(this->padder).fUnion + 4) = uVar3;
  this->roundingMode = UVar6;
  (this->grouper).fGrouping1 = iVar7;
  (this->grouper).fGrouping2 = iVar8;
  (this->grouper).fMinGrouping = iVar9;
  *(undefined2 *)&(this->grouper).field_0x6 = uVar10;
  (this->grouper).fStrategy = UVar11;
  *(undefined8 *)((long)&(this->precision).fUnion + 8) = uVar2;
  (this->precision).fRoundingMode = UVar12;
  *(undefined4 *)&(this->precision).field_0x1c = uVar13;
  (this->precision).fType = PVar14;
  *(undefined4 *)&(this->precision).field_0x4 = uVar15;
  (this->precision).fUnion.fracSig = FVar1;
  SymbolsWrapper::SymbolsWrapper(&this->symbols,&param_1->symbols);
  this->decimal = param_1->decimal;
  UVar16 = param_1->sign;
  this->unitWidth = param_1->unitWidth;
  this->sign = UVar16;
  Scale::Scale(&this->scale,&param_1->scale);
  pAVar4 = param_1->affixProvider;
  pPVar5 = param_1->rules;
  uVar2 = *(undefined8 *)((long)&param_1->currencySymbols + 4);
  *(undefined8 *)((long)&this->rules + 4) = *(undefined8 *)((long)&param_1->rules + 4);
  *(undefined8 *)((long)&this->currencySymbols + 4) = uVar2;
  this->affixProvider = pAVar4;
  this->rules = pPVar5;
  Locale::Locale(&this->locale,&param_1->locale);
  return;
}

Assistant:

struct U_I18N_API MacroProps : public UMemory {
    /** @internal */
    Notation notation;

    /** @internal */
    MeasureUnit unit; // = NoUnit::base();

    /** @internal */
    MeasureUnit perUnit; // = NoUnit::base();

    /** @internal */
    Precision precision;  // = Precision();  (bogus)

    /** @internal */
    UNumberFormatRoundingMode roundingMode = UNUM_ROUND_HALFEVEN;

    /** @internal */
    Grouper grouper;  // = Grouper();  (bogus)

    /** @internal */
    Padder padder;    // = Padder();   (bogus)

    /** @internal */
    IntegerWidth integerWidth; // = IntegerWidth(); (bogus)

    /** @internal */
    SymbolsWrapper symbols;

    // UNUM_XYZ_COUNT denotes null (bogus) values.

    /** @internal */
    UNumberUnitWidth unitWidth = UNUM_UNIT_WIDTH_COUNT;

    /** @internal */
    UNumberSignDisplay sign = UNUM_SIGN_COUNT;

    /** @internal */
    UNumberDecimalSeparatorDisplay decimal = UNUM_DECIMAL_SEPARATOR_COUNT;

    /** @internal */
    Scale scale;  // = Scale();  (benign value)

    /** @internal */
    const AffixPatternProvider* affixProvider = nullptr;  // no ownership

    /** @internal */
    const PluralRules* rules = nullptr;  // no ownership

    /** @internal */
    const CurrencySymbols* currencySymbols = nullptr;  // no ownership

    /** @internal */
    int32_t threshold = DEFAULT_THRESHOLD;

    /** @internal */
    Locale locale;

    // NOTE: Uses default copy and move constructors.

    /**
     * Check all members for errors.
     * @internal
     */
    bool copyErrorTo(UErrorCode &status) const {
        return notation.copyErrorTo(status) || precision.copyErrorTo(status) ||
               padder.copyErrorTo(status) || integerWidth.copyErrorTo(status) ||
               symbols.copyErrorTo(status) || scale.copyErrorTo(status);
    }
}